

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

text * lest::pluralise(text *__return_storage_ptr__,text *word,int n)

{
  pointer pcVar1;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (n == 1) {
    local_80 = local_70;
    pcVar1 = (word->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,pcVar1 + word->_M_string_length);
  }
  else {
    pcVar1 = (word->_M_dataplus)._M_p;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + word->_M_string_length);
    std::__cxx11::string::append((char *)&local_40);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_40 + local_38);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_60,local_60 + local_58);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_80,local_80 + local_78);
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if ((n != 1) && (local_60 != local_50)) {
    operator_delete(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

inline text pluralise( text word,int n )
{
    return n == 1 ? word : word + "s";
}